

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Loop::AreAllOperandsOutsideLoop(Loop *this,Instruction *inst)

{
  bool bVar1;
  DefUseManager *def_use_mgr;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  def_use_mgr = IRContext::get_def_use_mgr(this->context_);
  local_38._8_8_ = &def_use_mgr;
  local_20 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:462:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:462:7)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  bVar1 = Instruction::WhileEachInId(inst,(function<bool_(const_unsigned_int_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool Loop::AreAllOperandsOutsideLoop(const Instruction& inst) const {
  analysis::DefUseManager* def_use_mgr = GetContext()->get_def_use_mgr();

  const std::function<bool(const uint32_t*)> operand_outside_loop =
      [this, &def_use_mgr](const uint32_t* id) {
        return !this->IsInsideLoop(def_use_mgr->GetDef(*id));
      };

  return inst.WhileEachInId(operand_outside_loop);
}